

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# compact_functional_test.cc
# Opt level: O3

void compaction_daemon_test(size_t time_sec)

{
  fdb_status fVar1;
  int iVar2;
  size_t sVar3;
  size_t sVar4;
  fdb_file_info *kvs_config_00;
  void *__s2;
  char *pcVar5;
  long lVar6;
  uint uVar7;
  void *unaff_RBP;
  fdb_file_info *info_00;
  char *ptr_fhandle;
  fdb_kvs_handle *handle;
  undefined1 handle_00 [8];
  fdb_kvs_handle *unaff_R12;
  __atomic_base<unsigned_long> unaff_R13;
  __atomic_base<unsigned_long> _Var8;
  filemgr *ptr_fhandle_00;
  ulong uVar9;
  fdb_config *pfVar10;
  ulong uVar11;
  __atomic_base<unsigned_long> *unaff_R15;
  timeval tVar12;
  timeval tVar13;
  fdb_file_handle *dbfile;
  fdb_kvs_handle *db;
  fdb_file_handle *dbfile_manual;
  fdb_doc *rdoc;
  fdb_file_handle *dbfile_non;
  fdb_file_handle *dbfile_less;
  fdb_kvs_config kvs_config;
  fdb_kvs_handle *snapshot;
  fdb_kvs_handle *db_manual;
  fdb_kvs_handle *db_non;
  fdb_kvs_handle *db_less;
  fdb_file_handle *dbfile_new;
  timeval ts_cur;
  fdb_config fconfig;
  timeval ts_begin;
  timeval __test_begin;
  fdb_file_info info;
  char keybuf [256];
  char bodybuf [256];
  char metabuf [256];
  fdb_kvs_handle *pfStack_14308;
  undefined1 auStack_14300 [16];
  undefined1 auStack_142f0 [8];
  undefined1 auStack_142e8 [80];
  ulong uStack_14298;
  timeval tStack_14278;
  fdb_file_info afStack_14268 [3];
  fdb_file_info afStack_14168 [3];
  fdb_config fStack_14068;
  filemgr *pfStack_13f70;
  fdb_kvs_handle *pfStack_13f68;
  fdb_doc *pfStack_13f60;
  fdb_config *pfStack_13f58;
  __atomic_base<unsigned_long> *p_Stack_13f50;
  code *pcStack_13f48;
  fdb_file_handle *pfStack_13f38;
  fdb_kvs_handle *pfStack_13f30;
  timeval tStack_13f28;
  undefined1 auStack_13f17 [23];
  __atomic_base<unsigned_long> *p_Stack_13f00;
  timeval tStack_13ef8;
  undefined1 auStack_13ee8 [70];
  undefined1 uStack_13ea2;
  undefined8 uStack_13e98;
  filemgr *pfStack_13dd8;
  fdb_kvs_handle *pfStack_13dd0;
  fdb_doc *pfStack_13dc8;
  filemgr *pfStack_13dc0;
  __atomic_base<unsigned_long> *p_Stack_13db8;
  code *pcStack_13db0;
  undefined1 auStack_13da0 [8];
  undefined1 auStack_13d98 [8];
  undefined1 auStack_13d90 [8];
  __atomic_base<unsigned_long> _Stack_13d88;
  undefined1 auStack_13d80 [8];
  undefined1 auStack_13d78 [16];
  fdb_kvs_config fStack_13d68;
  atomic<unsigned_long> aStack_13d50;
  __atomic_base<unsigned_long> _Stack_13d48;
  __atomic_base<unsigned_long> _Stack_13d40;
  anon_union_8_2_31e36bfd_for__fdb_kvs_handle_6 aStack_13d38;
  undefined1 auStack_13d30 [8];
  undefined1 auStack_13d28 [16];
  undefined1 auStack_13d18 [16];
  atomic<unsigned_long> aStack_13d08;
  fdb_open_flags fStack_13cf4;
  ushort uStack_13cea;
  atomic<unsigned_long> aStack_13ce0;
  atomic<unsigned_long> aStack_13ca0;
  undefined1 auStack_13c20 [16];
  timeval tStack_13c10;
  undefined1 auStack_13c00 [328];
  char acStack_13ab8 [256];
  char acStack_139b8 [256];
  fdb_kvs_handle afStack_138b8 [153];
  
  ptr_fhandle_00 = (filemgr *)0x0;
  pcStack_13db0 = (code *)0x10fd83;
  auStack_13d78._8_8_ = time_sec;
  gettimeofday(&tStack_13c10,(__timezone_ptr_t)0x0);
  pcStack_13db0 = (code *)0x10fd88;
  memleak_start();
  pcStack_13db0 = (code *)0x10fd94;
  system("rm -rf  compact_test* > errorlog.txt");
  pcVar5 = auStack_13d18;
  pcStack_13db0 = (code *)0x10fda4;
  fdb_get_default_config();
  pcStack_13db0 = (code *)0x10fdae;
  fdb_get_default_kvs_config();
  auStack_13d18._8_8_ = 0;
  aStack_13d08.super___atomic_base<unsigned_long>._M_i = (__atomic_base<unsigned_long>)0x400;
  fStack_13cf4 = 1;
  uStack_13cea = 0x1e01;
  aStack_13ce0.super___atomic_base<unsigned_long>._M_i = (__atomic_base<unsigned_long>)1;
  aStack_13ca0.super___atomic_base<unsigned_long>._M_i = (__atomic_base<unsigned_long>)0;
  ptr_fhandle = auStack_13da0;
  pcStack_13db0 = (code *)0x10fde7;
  fVar1 = fdb_open((fdb_file_handle **)ptr_fhandle,"compact_test",(fdb_config *)pcVar5);
  if (fVar1 != FDB_RESULT_INVALID_CONFIG) goto LAB_001108c3;
  aStack_13ca0.super___atomic_base<unsigned_long>._M_i = (__atomic_base<unsigned_long>)4;
  pcStack_13db0 = (code *)0x10fe14;
  fdb_open((fdb_file_handle **)auStack_13da0,"compact_test",(fdb_config *)auStack_13d18);
  pcVar5 = auStack_13d98;
  pcStack_13db0 = (code *)0x10fe29;
  fdb_kvs_open_default((fdb_file_handle *)auStack_13da0,(fdb_kvs_handle **)pcVar5,&fStack_13d68);
  pcStack_13db0 = (code *)0x10fe3f;
  ptr_fhandle = (char *)auStack_13d98;
  fVar1 = fdb_set_log_callback
                    ((fdb_kvs_handle *)auStack_13d98,logCallbackFunc,"compaction_daemon_test");
  if (fVar1 != FDB_RESULT_SUCCESS) goto LAB_001108c8;
  pcStack_13db0 = (code *)0x10fe53;
  puts("Initialize..");
  unaff_R13._M_i = 0;
  uVar9 = 0;
  do {
    pcStack_13db0 = (code *)0x10fe75;
    sprintf(auStack_13c00 + 0x48,"key%04d",uVar9 & 0xffffffff);
    pcStack_13db0 = (code *)0x10fe8e;
    sprintf(acStack_139b8,"meta%04d",uVar9 & 0xffffffff);
    pcStack_13db0 = (code *)0x10fea7;
    sprintf(acStack_13ab8,"body%04d",uVar9 & 0xffffffff);
    unaff_R12 = (fdb_kvs_handle *)(&afStack_138b8[0].kvs_config.create_if_missing + unaff_R13._M_i);
    pcStack_13db0 = (code *)0x10feba;
    sVar3 = strlen(auStack_13c00 + 0x48);
    unaff_RBP = (void *)(sVar3 + 1);
    pcStack_13db0 = (code *)0x10fece;
    sVar3 = strlen(acStack_139b8);
    unaff_R15 = (__atomic_base<unsigned_long> *)(sVar3 + 1);
    pcStack_13db0 = (code *)0x10fedf;
    sVar3 = strlen(acStack_13ab8);
    pcStack_13db0 = (code *)0x10ff07;
    fdb_doc_create((fdb_doc **)unaff_R12,auStack_13c00 + 0x48,(size_t)unaff_RBP,acStack_139b8,
                   (size_t)unaff_R15,acStack_13ab8,sVar3 + 1);
    pcStack_13db0 = (code *)0x10ff19;
    fdb_set((fdb_kvs_handle *)auStack_13d98,
            *(fdb_doc **)(&afStack_138b8[0].kvs_config.create_if_missing + uVar9 * 8));
    uVar9 = uVar9 + 1;
    unaff_R13._M_i = unaff_R13._M_i + 8;
  } while (uVar9 != 10000);
  pcVar5 = auStack_13da0;
  pcStack_13db0 = (code *)0x10ff3c;
  fdb_commit((fdb_file_handle *)auStack_13da0,'\0');
  pcStack_13db0 = (code *)0x10ff44;
  fdb_close((fdb_file_handle *)auStack_13da0);
  pcStack_13db0 = (code *)0x10ff5b;
  ptr_fhandle = pcVar5;
  fVar1 = fdb_open((fdb_file_handle **)pcVar5,"compact_test",(fdb_config *)auStack_13d18);
  ptr_fhandle_00 = (filemgr *)0x2710;
  if (fVar1 != FDB_RESULT_SUCCESS) goto LAB_001108cd;
  pcStack_13db0 = (code *)0x10ff77;
  ptr_fhandle = (char *)auStack_13da0;
  fVar1 = fdb_kvs_open_default
                    ((fdb_file_handle *)auStack_13da0,(fdb_kvs_handle **)auStack_13d98,&fStack_13d68
                    );
  if (fVar1 != FDB_RESULT_SUCCESS) goto LAB_001108d2;
  pcStack_13db0 = (code *)0x10ff97;
  ptr_fhandle = (char *)auStack_13d98;
  fVar1 = fdb_set_log_callback
                    ((fdb_kvs_handle *)auStack_13d98,logCallbackFunc,"compaction_daemon_test");
  if (fVar1 != FDB_RESULT_SUCCESS) goto LAB_001108d7;
  pcVar5 = auStack_13c00;
  pcStack_13db0 = (code *)0x10ffb4;
  fdb_get_file_info((fdb_file_handle *)auStack_13da0,(fdb_file_info *)pcVar5);
  pcStack_13db0 = (code *)0x10ffc3;
  iVar2 = strcmp((char *)auStack_13c00._0_8_,"compact_test");
  if (iVar2 != 0) {
    pcStack_13db0 = (code *)0x10ffd4;
    compaction_daemon_test();
  }
  ptr_fhandle_00 = (filemgr *)(auStack_13c00 + 0x48);
  unaff_R15 = &_Stack_13d88;
  unaff_R12 = (fdb_kvs_handle *)0x0;
  _Var8._M_i = unaff_R13._M_i;
  do {
    pcStack_13db0 = (code *)0x10fff8;
    sprintf((char *)ptr_fhandle_00,"key%04d",(ulong)unaff_R12 & 0xffffffff);
    pcStack_13db0 = (code *)0x110000;
    sVar3 = strlen((char *)ptr_fhandle_00);
    pcStack_13db0 = (code *)0x11001f;
    fdb_doc_create((fdb_doc **)unaff_R15,ptr_fhandle_00,sVar3 + 1,(void *)0x0,0,(void *)0x0,0);
    pcStack_13db0 = (code *)0x11002e;
    fVar1 = fdb_get((fdb_kvs_handle *)auStack_13d98,(fdb_doc *)_Stack_13d88._M_i);
    unaff_R13._M_i = _Stack_13d88._M_i;
    if (fVar1 != FDB_RESULT_SUCCESS) {
LAB_0011089e:
      pcStack_13db0 = (code *)0x1108a3;
      compaction_daemon_test();
      goto LAB_001108a3;
    }
    unaff_RBP = *(void **)(_Stack_13d88._M_i + 0x40);
    pcVar5 = *(char **)(*(long *)(&afStack_138b8[0].kvs_config.create_if_missing +
                                 (long)unaff_R12 * 8) + 0x40);
    pcStack_13db0 = (code *)0x11005a;
    iVar2 = bcmp(unaff_RBP,pcVar5,*(size_t *)(_Stack_13d88._M_i + 0x10));
    _Var8._M_i = unaff_R13._M_i;
    if (iVar2 != 0) {
      pcStack_13db0 = (code *)0x11089e;
      compaction_daemon_test();
      goto LAB_0011089e;
    }
    pcStack_13db0 = (code *)0x11006a;
    fdb_doc_free((fdb_doc *)unaff_R13._M_i);
    unaff_R12 = (fdb_kvs_handle *)&(unaff_R12->kvs_config).field_0x1;
  } while (unaff_R12 != (fdb_kvs_handle *)0x2710);
  pcStack_13db0 = (code *)0x11008e;
  ptr_fhandle = (char *)auStack_13d98;
  fVar1 = fdb_snapshot_open((fdb_kvs_handle *)auStack_13d98,(fdb_kvs_handle **)&aStack_13d50,10000);
  if (fVar1 != FDB_RESULT_SUCCESS) goto LAB_001108dc;
  pcStack_13db0 = (code *)0x1100a0;
  fdb_kvs_close((fdb_kvs_handle *)aStack_13d50.super___atomic_base<unsigned_long>._M_i);
  pcVar5 = auStack_13da0;
  pcStack_13db0 = (code *)0x1100ad;
  fdb_close((fdb_file_handle *)auStack_13da0);
  pcStack_13db0 = (code *)0x1100b9;
  system("rm -rf  compact_test.meta > errorlog.txt");
  pcStack_13db0 = (code *)0x1100d0;
  ptr_fhandle = pcVar5;
  fVar1 = fdb_open((fdb_file_handle **)pcVar5,"compact_test",(fdb_config *)auStack_13d18);
  if (fVar1 != FDB_RESULT_SUCCESS) goto LAB_001108e1;
  pcStack_13db0 = (code *)0x1100ec;
  ptr_fhandle = (char *)auStack_13da0;
  fVar1 = fdb_kvs_open_default
                    ((fdb_file_handle *)auStack_13da0,(fdb_kvs_handle **)auStack_13d98,&fStack_13d68
                    );
  if (fVar1 != FDB_RESULT_SUCCESS) goto LAB_001108e6;
  pcStack_13db0 = (code *)0x11010c;
  ptr_fhandle = (char *)auStack_13d98;
  fVar1 = fdb_set_log_callback
                    ((fdb_kvs_handle *)auStack_13d98,logCallbackFunc,"compaction_daemon_test");
  if (fVar1 != FDB_RESULT_SUCCESS) goto LAB_001108eb;
  ptr_fhandle_00 = (filemgr *)(auStack_13c00 + 0x48);
  unaff_R15 = &_Stack_13d88;
  unaff_R12 = (fdb_kvs_handle *)0x0;
  do {
    pcStack_13db0 = (code *)0x110138;
    sprintf((char *)ptr_fhandle_00,"key%04d",(ulong)unaff_R12 & 0xffffffff);
    pcStack_13db0 = (code *)0x110140;
    sVar3 = strlen((char *)ptr_fhandle_00);
    pcStack_13db0 = (code *)0x11015f;
    fdb_doc_create((fdb_doc **)unaff_R15,ptr_fhandle_00,sVar3 + 1,(void *)0x0,0,(void *)0x0,0);
    pcStack_13db0 = (code *)0x11016e;
    fVar1 = fdb_get((fdb_kvs_handle *)auStack_13d98,(fdb_doc *)_Stack_13d88._M_i);
    _Var8._M_i = _Stack_13d88._M_i;
    if (fVar1 != FDB_RESULT_SUCCESS) goto LAB_001108ae;
    unaff_RBP = *(void **)(_Stack_13d88._M_i + 0x40);
    pcVar5 = *(char **)(*(long *)(&afStack_138b8[0].kvs_config.create_if_missing +
                                 (long)unaff_R12 * 8) + 0x40);
    pcStack_13db0 = (code *)0x11019a;
    iVar2 = bcmp(unaff_RBP,pcVar5,*(size_t *)(_Stack_13d88._M_i + 0x10));
    if (iVar2 != 0) goto LAB_001108a3;
    pcStack_13db0 = (code *)0x1101aa;
    fdb_doc_free((fdb_doc *)_Var8._M_i);
    unaff_R12 = (fdb_kvs_handle *)&(unaff_R12->kvs_config).field_0x1;
    unaff_R13._M_i = _Var8._M_i;
  } while (unaff_R12 != (fdb_kvs_handle *)0x2710);
  pcVar5 = auStack_13da0;
  pcStack_13db0 = (code *)0x1101c7;
  fdb_close((fdb_file_handle *)auStack_13da0);
  pcStack_13db0 = (code *)0x1101d3;
  system("mv  compact_test.0 compact_test.23 > errorlog.txt");
  pcStack_13db0 = (code *)0x1101ea;
  ptr_fhandle = pcVar5;
  fVar1 = fdb_open((fdb_file_handle **)pcVar5,"compact_test",(fdb_config *)auStack_13d18);
  if (fVar1 != FDB_RESULT_SUCCESS) goto LAB_001108f0;
  pcStack_13db0 = (code *)0x110206;
  ptr_fhandle = (char *)auStack_13da0;
  fVar1 = fdb_kvs_open_default
                    ((fdb_file_handle *)auStack_13da0,(fdb_kvs_handle **)auStack_13d98,&fStack_13d68
                    );
  if (fVar1 != FDB_RESULT_SUCCESS) goto LAB_001108f5;
  pcStack_13db0 = (code *)0x110226;
  ptr_fhandle = (char *)auStack_13d98;
  fVar1 = fdb_set_log_callback
                    ((fdb_kvs_handle *)auStack_13d98,logCallbackFunc,"compaction_daemon_test");
  if (fVar1 != FDB_RESULT_SUCCESS) goto LAB_001108fa;
  ptr_fhandle_00 = (filemgr *)(auStack_13c00 + 0x48);
  unaff_R15 = &_Stack_13d88;
  unaff_R12 = (fdb_kvs_handle *)0x0;
  do {
    pcStack_13db0 = (code *)0x110252;
    sprintf((char *)ptr_fhandle_00,"key%04d",(ulong)unaff_R12 & 0xffffffff);
    pcStack_13db0 = (code *)0x11025a;
    sVar3 = strlen((char *)ptr_fhandle_00);
    pcStack_13db0 = (code *)0x110279;
    fdb_doc_create((fdb_doc **)unaff_R15,ptr_fhandle_00,sVar3 + 1,(void *)0x0,0,(void *)0x0,0);
    pcStack_13db0 = (code *)0x110288;
    ptr_fhandle = (char *)auStack_13d98;
    fVar1 = fdb_get((fdb_kvs_handle *)auStack_13d98,(fdb_doc *)_Stack_13d88._M_i);
    _Var8._M_i = _Stack_13d88._M_i;
    if (fVar1 != FDB_RESULT_SUCCESS) goto LAB_001108be;
    unaff_RBP = *(void **)(_Stack_13d88._M_i + 0x40);
    pcVar5 = *(char **)(*(long *)(&afStack_138b8[0].kvs_config.create_if_missing +
                                 (long)unaff_R12 * 8) + 0x40);
    pcStack_13db0 = (code *)0x1102b4;
    iVar2 = bcmp(unaff_RBP,pcVar5,*(size_t *)(_Stack_13d88._M_i + 0x10));
    if (iVar2 != 0) goto LAB_001108b3;
    pcStack_13db0 = (code *)0x1102c4;
    fdb_doc_free((fdb_doc *)_Var8._M_i);
    unaff_R12 = (fdb_kvs_handle *)&(unaff_R12->kvs_config).field_0x1;
    unaff_R13._M_i = _Var8._M_i;
  } while (unaff_R12 != (fdb_kvs_handle *)0x2710);
  pcStack_13db0 = (code *)0x1102de;
  fdb_close((fdb_file_handle *)auStack_13da0);
  ptr_fhandle = auStack_13d78;
  pcStack_13db0 = (code *)0x1102f7;
  fVar1 = fdb_open((fdb_file_handle **)ptr_fhandle,"compact_test_less",(fdb_config *)auStack_13d18);
  if (fVar1 != FDB_RESULT_SUCCESS) goto LAB_001108ff;
  pcStack_13db0 = (code *)0x110313;
  ptr_fhandle = (char *)auStack_13d78._0_8_;
  fVar1 = fdb_kvs_open_default
                    ((fdb_file_handle *)auStack_13d78._0_8_,(fdb_kvs_handle **)&aStack_13d38.seqtree
                     ,&fStack_13d68);
  if (fVar1 != FDB_RESULT_SUCCESS) goto LAB_00110904;
  uStack_13cea = uStack_13cea & 0xff;
  ptr_fhandle = auStack_13d80;
  pcStack_13db0 = (code *)0x110338;
  fVar1 = fdb_open((fdb_file_handle **)ptr_fhandle,"compact_test_non",(fdb_config *)auStack_13d18);
  if (fVar1 != FDB_RESULT_SUCCESS) goto LAB_00110909;
  pcStack_13db0 = (code *)0x110354;
  ptr_fhandle = (char *)auStack_13d80;
  fVar1 = fdb_kvs_open_default
                    ((fdb_file_handle *)auStack_13d80,(fdb_kvs_handle **)&_Stack_13d40,&fStack_13d68
                    );
  if (fVar1 != FDB_RESULT_SUCCESS) goto LAB_0011090e;
  uStack_13cea = uStack_13cea & 0xff00;
  ptr_fhandle = auStack_13d90;
  pcStack_13db0 = (code *)0x110379;
  fVar1 = fdb_open((fdb_file_handle **)ptr_fhandle,"compact_test_manual",(fdb_config *)auStack_13d18
                  );
  if (fVar1 != FDB_RESULT_SUCCESS) goto LAB_00110913;
  pcStack_13db0 = (code *)0x110395;
  ptr_fhandle = (char *)auStack_13d90;
  fVar1 = fdb_kvs_open_default
                    ((fdb_file_handle *)auStack_13d90,(fdb_kvs_handle **)&_Stack_13d48,&fStack_13d68
                    );
  if (fVar1 != FDB_RESULT_SUCCESS) goto LAB_00110918;
  uStack_13cea = 0x1e01;
  ptr_fhandle = auStack_13da0;
  pcStack_13db0 = (code *)0x1103bc;
  fVar1 = fdb_open((fdb_file_handle **)ptr_fhandle,"compact_test",(fdb_config *)auStack_13d18);
  if (fVar1 != FDB_RESULT_SUCCESS) goto LAB_0011091d;
  pcStack_13db0 = (code *)0x1103d8;
  ptr_fhandle = (char *)auStack_13da0;
  fVar1 = fdb_kvs_open_default
                    ((fdb_file_handle *)auStack_13da0,(fdb_kvs_handle **)auStack_13d98,&fStack_13d68
                    );
  if (fVar1 != FDB_RESULT_SUCCESS) goto LAB_00110922;
  pcStack_13db0 = (code *)0x1103f8;
  ptr_fhandle = (char *)auStack_13d98;
  fVar1 = fdb_set_log_callback
                    ((fdb_kvs_handle *)auStack_13d98,logCallbackFunc,"compaction_daemon_test");
  if (fVar1 != FDB_RESULT_SUCCESS) goto LAB_00110927;
  _Var8._M_i = 0;
  pcStack_13db0 = (code *)0x110416;
  printf("wait for %d seconds..\n");
  pcVar5 = auStack_13c20;
  pcStack_13db0 = (code *)0x110428;
  gettimeofday((timeval *)pcVar5,(__timezone_ptr_t)0x0);
  tVar13.tv_usec = auStack_13c20._8_8_;
  tVar13.tv_sec = auStack_13c20._0_8_;
  unaff_R12 = (fdb_kvs_handle *)auStack_13d28;
  while( true ) {
    pcStack_13db0 = (code *)0x110449;
    fdb_set((fdb_kvs_handle *)auStack_13d98,
            *(fdb_doc **)(&afStack_138b8[0].kvs_config.create_if_missing + _Var8._M_i * 8));
    pcStack_13db0 = (code *)0x110455;
    fdb_commit((fdb_file_handle *)auStack_13da0,'\0');
    if ((ushort)((ushort)((short)_Var8._M_i * 0x5c29) >> 2 | (short)_Var8._M_i * 0x4000) < 0x290) {
      pcStack_13db0 = (code *)0x11047c;
      fdb_set((fdb_kvs_handle *)aStack_13d38.seqtree,
              *(fdb_doc **)(&afStack_138b8[0].kvs_config.create_if_missing + _Var8._M_i * 8));
      pcStack_13db0 = (code *)0x110488;
      fdb_commit((fdb_file_handle *)auStack_13d78._0_8_,'\0');
    }
    pcStack_13db0 = (code *)0x11049a;
    fdb_set((fdb_kvs_handle *)_Stack_13d40._M_i,
            *(fdb_doc **)(&afStack_138b8[0].kvs_config.create_if_missing + _Var8._M_i * 8));
    pcStack_13db0 = (code *)0x1104a6;
    fdb_commit((fdb_file_handle *)auStack_13d80,'\0');
    pcStack_13db0 = (code *)0x1104b8;
    fdb_set((fdb_kvs_handle *)_Stack_13d48._M_i,
            *(fdb_doc **)(&afStack_138b8[0].kvs_config.create_if_missing + _Var8._M_i * 8));
    pcStack_13db0 = (code *)0x1104c4;
    fdb_commit((fdb_file_handle *)auStack_13d90,'\0');
    pcStack_13db0 = (code *)0x1104ce;
    gettimeofday((timeval *)unaff_R12,(__timezone_ptr_t)0x0);
    pcStack_13db0 = (code *)0x1104e9;
    tVar12 = _utime_gap(tVar13,(timeval)auStack_13d28);
    if ((ulong)auStack_13d78._8_8_ <= (hbtrie *)tVar12.tv_sec) break;
    _Var8._M_i = (long)&((fdb_doc *)_Var8._M_i)->keylen + 1;
    if ((fdb_doc *)_Var8._M_i == (fdb_doc *)0x2710) {
      _Var8._M_i = 0;
    }
  }
  pcStack_13db0 = (code *)0x110517;
  ptr_fhandle = (char *)auStack_13da0;
  fVar1 = fdb_set_daemon_compaction_interval((fdb_file_handle *)auStack_13da0,0x3c);
  ptr_fhandle_00 = (filemgr *)auStack_13c20._0_8_;
  unaff_R15 = (__atomic_base<unsigned_long> *)auStack_13c20._8_8_;
  if (fVar1 != FDB_RESULT_SUCCESS) goto LAB_0011092c;
  pcStack_13db0 = (code *)0x11052e;
  ptr_fhandle = (char *)auStack_13da0;
  fVar1 = fdb_set_daemon_compaction_interval((fdb_file_handle *)auStack_13da0,1);
  if (fVar1 != FDB_RESULT_SUCCESS) goto LAB_00110931;
  pcStack_13db0 = (code *)0x110542;
  ptr_fhandle = (char *)auStack_13d80;
  fVar1 = fdb_compact((fdb_file_handle *)auStack_13d80,(char *)0x0);
  if (fVar1 != FDB_RESULT_SUCCESS) goto LAB_00110936;
  pcStack_13db0 = (code *)0x11055b;
  ptr_fhandle = (char *)auStack_13d90;
  fVar1 = fdb_compact((fdb_file_handle *)auStack_13d90,"compact_test_manual_compacted");
  if (fVar1 != FDB_RESULT_SUCCESS) goto LAB_0011093b;
  uStack_13cea = uStack_13cea & 0xff00;
  ptr_fhandle = auStack_13d30;
  pcStack_13db0 = (code *)0x110580;
  fVar1 = fdb_open((fdb_file_handle **)ptr_fhandle,"compact_test_manual_compacted",
                   (fdb_config *)auStack_13d18);
  if (fVar1 != FDB_RESULT_SUCCESS) goto LAB_00110940;
  pcStack_13db0 = (code *)0x11059c;
  ptr_fhandle = (char *)auStack_13d90;
  fVar1 = fdb_switch_compaction_mode((fdb_file_handle *)auStack_13d90,'\x01',0x1e);
  if (fVar1 != FDB_RESULT_FILE_IS_BUSY) goto LAB_00110945;
  pcStack_13db0 = (code *)0x1105af;
  fVar1 = fdb_close((fdb_file_handle *)auStack_13d30);
  ptr_fhandle = (char *)auStack_13d30;
  if (fVar1 != FDB_RESULT_SUCCESS) goto LAB_0011094a;
  pcStack_13db0 = (code *)0x1105cb;
  ptr_fhandle = (char *)auStack_13d90;
  fVar1 = fdb_switch_compaction_mode((fdb_file_handle *)auStack_13d90,'\x01',10);
  if (fVar1 != FDB_RESULT_SUCCESS) goto LAB_0011094f;
  pcStack_13db0 = (code *)0x1105e7;
  ptr_fhandle = (char *)auStack_13d90;
  fVar1 = fdb_switch_compaction_mode((fdb_file_handle *)auStack_13d90,'\x01',0x1e);
  if (fVar1 != FDB_RESULT_SUCCESS) goto LAB_00110954;
  pcStack_13db0 = (code *)0x1105f9;
  ptr_fhandle = (char *)auStack_13d90;
  fVar1 = fdb_close((fdb_file_handle *)auStack_13d90);
  if (fVar1 != FDB_RESULT_SUCCESS) goto LAB_00110959;
  uStack_13cea = CONCAT11(uStack_13cea._1_1_,1);
  ptr_fhandle = auStack_13d90;
  pcStack_13db0 = (code *)0x11061e;
  fVar1 = fdb_open((fdb_file_handle **)ptr_fhandle,"compact_test_manual_compacted",
                   (fdb_config *)auStack_13d18);
  if (fVar1 != FDB_RESULT_SUCCESS) goto LAB_0011095e;
  pcStack_13db0 = (code *)0x110634;
  ptr_fhandle = (char *)auStack_13d80;
  fVar1 = fdb_switch_compaction_mode((fdb_file_handle *)auStack_13d80,'\0',0);
  if (fVar1 != FDB_RESULT_SUCCESS) goto LAB_00110963;
  pcStack_13db0 = (code *)0x110646;
  ptr_fhandle = (char *)auStack_13d80;
  fVar1 = fdb_close((fdb_file_handle *)auStack_13d80);
  if (fVar1 != FDB_RESULT_SUCCESS) goto LAB_00110968;
  uStack_13cea = uStack_13cea & 0xff00;
  ptr_fhandle = auStack_13d80;
  pcStack_13db0 = (code *)0x11066b;
  fVar1 = fdb_open((fdb_file_handle **)ptr_fhandle,"compact_test_non",(fdb_config *)auStack_13d18);
  if (fVar1 != FDB_RESULT_SUCCESS) goto LAB_0011096d;
  pcVar5 = "compact_test_non.manual";
  pcStack_13db0 = (code *)0x110687;
  fdb_compact((fdb_file_handle *)auStack_13d80,"compact_test_non.manual");
  ptr_fhandle_00 = (filemgr *)auStack_13da0;
  pcStack_13db0 = (code *)0x110694;
  fdb_close((fdb_file_handle *)auStack_13da0);
  pcStack_13db0 = (code *)0x11069e;
  fdb_close((fdb_file_handle *)auStack_13d78._0_8_);
  pcStack_13db0 = (code *)0x1106a8;
  fdb_close((fdb_file_handle *)auStack_13d90);
  uStack_13cea = CONCAT11(uStack_13cea._1_1_,1);
  pcStack_13db0 = (code *)0x1106bf;
  ptr_fhandle = (char *)ptr_fhandle_00;
  fVar1 = fdb_open((fdb_file_handle **)ptr_fhandle_00,"compact_test_non.manual",
                   (fdb_config *)auStack_13d18);
  if (fVar1 != FDB_RESULT_INVALID_COMPACTION_MODE) goto LAB_00110972;
  ptr_fhandle = "compact_test_non.manual";
  pcStack_13db0 = (code *)0x1106dc;
  fVar1 = fdb_destroy("compact_test_non.manual",(fdb_config *)auStack_13d18);
  if (fVar1 != FDB_RESULT_INVALID_COMPACTION_MODE) goto LAB_00110977;
  uStack_13cea = uStack_13cea & 0xff00;
  ptr_fhandle = auStack_13da0;
  pcStack_13db0 = (code *)0x110702;
  fVar1 = fdb_open((fdb_file_handle **)ptr_fhandle,"compact_test_manual_compacted",
                   (fdb_config *)auStack_13d18);
  if (fVar1 != FDB_RESULT_INVALID_COMPACTION_MODE) goto LAB_0011097c;
  ptr_fhandle = "compact_test_manual_compacted";
  pcStack_13db0 = (code *)0x11071f;
  fVar1 = fdb_destroy("compact_test_manual_compacted",(fdb_config *)auStack_13d18);
  if (fVar1 != FDB_RESULT_INVALID_COMPACTION_MODE) goto LAB_00110981;
  uStack_13cea = CONCAT11(uStack_13cea._1_1_,1);
  ptr_fhandle = "compact_test_manual_compacted";
  pcStack_13db0 = (code *)0x110740;
  fVar1 = fdb_destroy("compact_test_manual_compacted",(fdb_config *)auStack_13d18);
  if (fVar1 != FDB_RESULT_SUCCESS) goto LAB_00110986;
  uStack_13cea = uStack_13cea & 0xff00;
  ptr_fhandle = "compact_test_non.manual";
  pcStack_13db0 = (code *)0x110760;
  fVar1 = fdb_destroy("compact_test_non.manual",(fdb_config *)auStack_13d18);
  if (fVar1 != FDB_RESULT_FILE_IS_BUSY) goto LAB_0011098b;
  pcStack_13db0 = (code *)0x110773;
  fdb_close((fdb_file_handle *)auStack_13d80);
  pcStack_13db0 = (code *)0x110778;
  fVar1 = fdb_shutdown();
  ptr_fhandle = (char *)auStack_13d80;
  if (fVar1 != FDB_RESULT_SUCCESS) goto LAB_00110990;
  ptr_fhandle = "compact_test_non.manual";
  pcStack_13db0 = (code *)0x110794;
  fVar1 = fdb_destroy("compact_test_non.manual",(fdb_config *)auStack_13d18);
  if (fVar1 != FDB_RESULT_SUCCESS) goto LAB_00110995;
  fStack_13cf4 = 2;
  ptr_fhandle = auStack_13da0;
  pcStack_13db0 = (code *)0x1107bc;
  fVar1 = fdb_open((fdb_file_handle **)ptr_fhandle,"./compact_test_manual_compacted",
                   (fdb_config *)auStack_13d18);
  if (fVar1 != FDB_RESULT_NO_SUCH_FILE) goto LAB_0011099a;
  ptr_fhandle = auStack_13da0;
  pcStack_13db0 = (code *)0x1107de;
  fVar1 = fdb_open((fdb_file_handle **)ptr_fhandle,"./compact_test_manual_compacted.meta",
                   (fdb_config *)auStack_13d18);
  if (fVar1 != FDB_RESULT_NO_SUCH_FILE) goto LAB_0011099f;
  ptr_fhandle = auStack_13da0;
  pcStack_13db0 = (code *)0x110800;
  fVar1 = fdb_open((fdb_file_handle **)ptr_fhandle,"compact_test_non",(fdb_config *)auStack_13d18);
  if (fVar1 != FDB_RESULT_NO_SUCH_FILE) goto LAB_001109a4;
  ptr_fhandle = auStack_13da0;
  pcStack_13db0 = (code *)0x110822;
  fVar1 = fdb_open((fdb_file_handle **)ptr_fhandle,"compact_test_non.manual",
                   (fdb_config *)auStack_13d18);
  if (fVar1 == FDB_RESULT_NO_SUCH_FILE) {
    lVar6 = 0;
    do {
      pcStack_13db0 = (code *)0x11083a;
      fdb_doc_free(*(fdb_doc **)(&afStack_138b8[0].kvs_config.create_if_missing + lVar6 * 8));
      lVar6 = lVar6 + 1;
    } while (lVar6 != 10000);
    pcStack_13db0 = (code *)0x11084b;
    fdb_shutdown();
    pcStack_13db0 = (code *)0x110850;
    memleak_end();
    pcVar5 = "%s PASSED\n";
    if (compaction_daemon_test(unsigned_long)::__test_pass != '\0') {
      pcVar5 = "%s FAILED\n";
    }
    pcStack_13db0 = (code *)0x110881;
    fprintf(_stderr,pcVar5,"compaction daemon test");
    return;
  }
  goto LAB_001109a9;
LAB_00110f58:
  auto_compaction_with_custom_cmp_function();
LAB_00110f5d:
  auto_compaction_with_custom_cmp_function();
LAB_00110f62:
  auto_compaction_with_custom_cmp_function();
  goto LAB_00110f67;
LAB_001108a3:
  pcStack_13db0 = (code *)0x1108ae;
  compaction_daemon_test();
  unaff_R13._M_i = _Var8._M_i;
LAB_001108ae:
  _Var8._M_i = unaff_R13._M_i;
  pcStack_13db0 = (code *)0x1108b3;
  compaction_daemon_test();
LAB_001108b3:
  pcStack_13db0 = (code *)0x1108be;
  ptr_fhandle = pcVar5;
  compaction_daemon_test();
  unaff_R13._M_i = _Var8._M_i;
LAB_001108be:
  unaff_R15 = &_Stack_13d88;
  ptr_fhandle_00 = (filemgr *)(auStack_13c00 + 0x48);
  pcStack_13db0 = (code *)0x1108c3;
  compaction_daemon_test();
LAB_001108c3:
  pcStack_13db0 = (code *)0x1108c8;
  compaction_daemon_test();
LAB_001108c8:
  pcStack_13db0 = (code *)0x1108cd;
  compaction_daemon_test();
LAB_001108cd:
  pcStack_13db0 = (code *)0x1108d2;
  compaction_daemon_test();
LAB_001108d2:
  pcStack_13db0 = (code *)0x1108d7;
  compaction_daemon_test();
LAB_001108d7:
  pcStack_13db0 = (code *)0x1108dc;
  compaction_daemon_test();
LAB_001108dc:
  pcStack_13db0 = (code *)0x1108e1;
  compaction_daemon_test();
LAB_001108e1:
  pcStack_13db0 = (code *)0x1108e6;
  compaction_daemon_test();
LAB_001108e6:
  pcStack_13db0 = (code *)0x1108eb;
  compaction_daemon_test();
  _Var8._M_i = unaff_R13._M_i;
LAB_001108eb:
  pcStack_13db0 = (code *)0x1108f0;
  compaction_daemon_test();
LAB_001108f0:
  pcStack_13db0 = (code *)0x1108f5;
  compaction_daemon_test();
LAB_001108f5:
  pcStack_13db0 = (code *)0x1108fa;
  compaction_daemon_test();
LAB_001108fa:
  pcStack_13db0 = (code *)0x1108ff;
  compaction_daemon_test();
LAB_001108ff:
  pcStack_13db0 = (code *)0x110904;
  compaction_daemon_test();
LAB_00110904:
  pcStack_13db0 = (code *)0x110909;
  compaction_daemon_test();
LAB_00110909:
  pcStack_13db0 = (code *)0x11090e;
  compaction_daemon_test();
LAB_0011090e:
  pcStack_13db0 = (code *)0x110913;
  compaction_daemon_test();
LAB_00110913:
  pcStack_13db0 = (code *)0x110918;
  compaction_daemon_test();
LAB_00110918:
  pcStack_13db0 = (code *)0x11091d;
  compaction_daemon_test();
LAB_0011091d:
  pcStack_13db0 = (code *)0x110922;
  compaction_daemon_test();
LAB_00110922:
  pcStack_13db0 = (code *)0x110927;
  compaction_daemon_test();
LAB_00110927:
  pcStack_13db0 = (code *)0x11092c;
  compaction_daemon_test();
LAB_0011092c:
  pcStack_13db0 = (code *)0x110931;
  compaction_daemon_test();
LAB_00110931:
  pcStack_13db0 = (code *)0x110936;
  compaction_daemon_test();
LAB_00110936:
  pcStack_13db0 = (code *)0x11093b;
  compaction_daemon_test();
LAB_0011093b:
  pcStack_13db0 = (code *)0x110940;
  compaction_daemon_test();
LAB_00110940:
  pcStack_13db0 = (code *)0x110945;
  compaction_daemon_test();
LAB_00110945:
  pcStack_13db0 = (code *)0x11094a;
  compaction_daemon_test();
LAB_0011094a:
  pcStack_13db0 = (code *)0x11094f;
  compaction_daemon_test();
LAB_0011094f:
  pcStack_13db0 = (code *)0x110954;
  compaction_daemon_test();
LAB_00110954:
  pcStack_13db0 = (code *)0x110959;
  compaction_daemon_test();
LAB_00110959:
  pcStack_13db0 = (code *)0x11095e;
  compaction_daemon_test();
LAB_0011095e:
  pcStack_13db0 = (code *)0x110963;
  compaction_daemon_test();
LAB_00110963:
  pcStack_13db0 = (code *)0x110968;
  compaction_daemon_test();
LAB_00110968:
  pcStack_13db0 = (code *)0x11096d;
  compaction_daemon_test();
LAB_0011096d:
  pcStack_13db0 = (code *)0x110972;
  compaction_daemon_test();
LAB_00110972:
  pcStack_13db0 = (code *)0x110977;
  compaction_daemon_test();
LAB_00110977:
  pcStack_13db0 = (code *)0x11097c;
  compaction_daemon_test();
LAB_0011097c:
  pcStack_13db0 = (code *)0x110981;
  compaction_daemon_test();
LAB_00110981:
  pcStack_13db0 = (code *)0x110986;
  compaction_daemon_test();
LAB_00110986:
  pcStack_13db0 = (code *)0x11098b;
  compaction_daemon_test();
LAB_0011098b:
  pcStack_13db0 = (code *)0x110990;
  compaction_daemon_test();
LAB_00110990:
  pcStack_13db0 = (code *)0x110995;
  compaction_daemon_test();
LAB_00110995:
  pcStack_13db0 = (code *)0x11099a;
  compaction_daemon_test();
LAB_0011099a:
  pcStack_13db0 = (code *)0x11099f;
  compaction_daemon_test();
LAB_0011099f:
  pcStack_13db0 = (code *)0x1109a4;
  compaction_daemon_test();
LAB_001109a4:
  pcStack_13db0 = (code *)0x1109a9;
  compaction_daemon_test();
LAB_001109a9:
  pcStack_13db0 = auto_compaction_with_concurrent_insert_test;
  compaction_daemon_test();
  pcStack_13f48 = (code *)0x1109ce;
  pfStack_13dd8 = (filemgr *)pcVar5;
  pfStack_13dd0 = unaff_R12;
  pfStack_13dc8 = (fdb_doc *)_Var8._M_i;
  pfStack_13dc0 = ptr_fhandle_00;
  p_Stack_13db8 = unaff_R15;
  pcStack_13db0 = (code *)unaff_RBP;
  gettimeofday(&tStack_13ef8,(__timezone_ptr_t)0x0);
  pcStack_13f48 = (code *)0x1109d3;
  memleak_start();
  pcStack_13f48 = (code *)0x1109df;
  system("rm -rf  compact_test* > errorlog.txt");
  pcStack_13f48 = (code *)0x1109ec;
  fdb_get_default_config();
  uStack_13ea2 = 1;
  uStack_13e98._0_2_ = 1;
  uStack_13e98._2_2_ = 0;
  uStack_13e98._4_4_ = 0;
  pcStack_13f48 = (code *)0x110a0d;
  fVar1 = fdb_open(&pfStack_13f38,"compact_test",(fdb_config *)(auStack_13ee8 + 0x18));
  pfVar10 = (fdb_config *)(auStack_13ee8 + 0x18);
  if (fVar1 == FDB_RESULT_SUCCESS) {
    pfVar10 = (fdb_config *)auStack_13ee8;
    pcStack_13f48 = (code *)0x110a22;
    fdb_get_default_kvs_config();
    pcStack_13f48 = (code *)0x110a34;
    fVar1 = fdb_kvs_open_default(pfStack_13f38,&pfStack_13f30,(fdb_kvs_config *)pfVar10);
    if (fVar1 != FDB_RESULT_SUCCESS) goto LAB_00110b65;
    pcStack_13f48 = (code *)0x110a4b;
    gettimeofday((timeval *)(auStack_13f17 + 0xf),(__timezone_ptr_t)0x0);
    pcStack_13f48 = (code *)0x110a5b;
    printf("wait for %d seconds..\n",(ulong)ptr_fhandle & 0xffffffff);
    tVar12.tv_usec = (__suseconds_t)p_Stack_13f00;
    tVar12.tv_sec = auStack_13f17._15_8_;
    _Var8._M_i = (__int_type_conflict)auStack_13f17;
    unaff_RBP = (void *)0x0;
    do {
      iVar2 = (int)unaff_RBP;
      pcStack_13f48 = (code *)0x110a7c;
      sprintf((char *)_Var8._M_i,"%d",unaff_RBP);
      unaff_R12 = pfStack_13f30;
      pcStack_13f48 = (code *)0x110a89;
      sVar3 = strlen((char *)_Var8._M_i);
      pcStack_13f48 = (code *)0x110aa4;
      fVar1 = fdb_set_kv(unaff_R12,(void *)_Var8._M_i,sVar3,"value",5);
      pfVar10 = (fdb_config *)auStack_13f17._15_8_;
      unaff_R15 = p_Stack_13f00;
      if (fVar1 != FDB_RESULT_SUCCESS) {
LAB_00110b5b:
        pcStack_13f48 = (code *)0x110b60;
        auto_compaction_with_concurrent_insert_test();
        goto LAB_00110b60;
      }
      pcStack_13f48 = (code *)0x110ab8;
      fVar1 = fdb_commit(pfStack_13f38,'\0');
      if (fVar1 != FDB_RESULT_SUCCESS) {
        pcStack_13f48 = (code *)0x110b5b;
        auto_compaction_with_concurrent_insert_test();
        goto LAB_00110b5b;
      }
      pcStack_13f48 = (code *)0x110acc;
      gettimeofday((timeval *)&tStack_13f28,(__timezone_ptr_t)0x0);
      pcStack_13f48 = (code *)0x110ae1;
      tVar13 = _utime_gap(tVar12,tStack_13f28);
    } while (((filemgr *)tVar13.tv_sec < ptr_fhandle) &&
            (unaff_RBP = (void *)(ulong)(iVar2 + 1), iVar2 != 99999));
    pcStack_13f48 = (code *)0x110b01;
    fVar1 = fdb_close(pfStack_13f38);
    if (fVar1 != FDB_RESULT_SUCCESS) goto LAB_00110b6a;
    pcStack_13f48 = (code *)0x110b0a;
    fVar1 = fdb_shutdown();
    if (fVar1 == FDB_RESULT_SUCCESS) {
      pcStack_13f48 = (code *)0x110b13;
      memleak_end();
      pcVar5 = "%s PASSED\n";
      if (auto_compaction_with_concurrent_insert_test(unsigned_long)::__test_pass != '\0') {
        pcVar5 = "%s FAILED\n";
      }
      pcStack_13f48 = (code *)0x110b44;
      fprintf(_stderr,pcVar5,"auto compaction with concurrent insert test");
      return;
    }
  }
  else {
LAB_00110b60:
    pcStack_13f48 = (code *)0x110b65;
    auto_compaction_with_concurrent_insert_test();
LAB_00110b65:
    pcStack_13f48 = (code *)0x110b6a;
    auto_compaction_with_concurrent_insert_test();
LAB_00110b6a:
    pcStack_13f48 = (code *)0x110b6f;
    auto_compaction_with_concurrent_insert_test();
  }
  pcStack_13f48 = auto_compaction_with_custom_cmp_function;
  auto_compaction_with_concurrent_insert_test();
  pfStack_13f70 = (filemgr *)ptr_fhandle;
  pfStack_13f68 = unaff_R12;
  pfStack_13f60 = (fdb_doc *)_Var8._M_i;
  pfStack_13f58 = pfVar10;
  p_Stack_13f50 = unaff_R15;
  pcStack_13f48 = (code *)unaff_RBP;
  gettimeofday(&tStack_14278,(__timezone_ptr_t)0x0);
  memleak_start();
  auStack_142e8._32_8_ = (btree *)0x0;
  auStack_142e8._24_8_ = _compact_test_keycmp;
  system("rm -rf  compact_test* > errorlog.txt");
  fdb_get_default_config();
  fStack_14068.wal_threshold = 0x1000;
  fStack_14068.compaction_mode = '\x01';
  fStack_14068.compaction_threshold = '\n';
  fStack_14068.compactor_sleep_duration = 1;
  info_00 = (fdb_file_info *)0x14d0c5;
  handle = (fdb_kvs_handle *)&pfStack_14308;
  kvs_config_00 = (fdb_file_info *)0x1;
  fVar1 = fdb_open_custom_cmp((fdb_file_handle **)handle,"compact_test",&fStack_14068,1,
                              (char **)(auStack_142e8 + 0x20),
                              (fdb_custom_cmp_variable *)(auStack_142e8 + 0x18),(void **)0x0);
  if (fVar1 == FDB_RESULT_SUCCESS) {
    fdb_get_default_kvs_config();
    auStack_142e8._16_8_ = afStack_14268[0].doc_count;
    auStack_142e8._0_8_ = afStack_14268[0].filename;
    auStack_142e8._8_8_ = afStack_14268[0].new_filename;
    info_00 = (fdb_file_info *)auStack_14300;
    handle = pfStack_14308;
    fVar1 = fdb_kvs_open_default
                      ((fdb_file_handle *)pfStack_14308,(fdb_kvs_handle **)info_00,
                       (fdb_kvs_config *)auStack_142e8);
    if (fVar1 != FDB_RESULT_SUCCESS) goto LAB_00110f6c;
    info_00 = (fdb_file_info *)auStack_142f0;
    kvs_config_00 = (fdb_file_info *)auStack_142e8;
    handle = pfStack_14308;
    fVar1 = fdb_kvs_open((fdb_file_handle *)pfStack_14308,(fdb_kvs_handle **)info_00,"db",
                         (fdb_kvs_config *)kvs_config_00);
    if (fVar1 != FDB_RESULT_SUCCESS) goto LAB_00110f71;
    uVar9 = 0;
    do {
      sprintf((char *)afStack_14268,"key%06d",uVar9);
      sprintf((char *)afStack_14168,"body%06d",uVar9);
      handle = (fdb_kvs_handle *)auStack_14300._0_8_;
      sVar3 = strlen((char *)afStack_14268);
      sVar4 = strlen((char *)afStack_14168);
      kvs_config_00 = afStack_14168;
      info_00 = afStack_14268;
      fVar1 = fdb_set_kv(handle,afStack_14268,sVar3,afStack_14168,sVar4);
      handle_00 = auStack_142f0;
      if (fVar1 != FDB_RESULT_SUCCESS) {
LAB_00110f53:
        auto_compaction_with_custom_cmp_function();
        goto LAB_00110f58;
      }
      sVar3 = strlen((char *)afStack_14268);
      sVar4 = strlen((char *)afStack_14168);
      kvs_config_00 = afStack_14168;
      info_00 = afStack_14268;
      fVar1 = fdb_set_kv((fdb_kvs_handle *)handle_00,afStack_14268,sVar3,afStack_14168,sVar4);
      if (fVar1 != FDB_RESULT_SUCCESS) {
        auto_compaction_with_custom_cmp_function();
        handle = (fdb_kvs_handle *)handle_00;
        goto LAB_00110f53;
      }
      uVar7 = (int)uVar9 + 1;
      uVar9 = (ulong)uVar7;
    } while (uVar7 != 10000);
    kvs_config_00 = (fdb_file_info *)auStack_142e8;
    auStack_142e8._8_8_ = _compact_test_keycmp;
    info_00 = (fdb_file_info *)(auStack_14300 + 8);
    handle = pfStack_14308;
    fVar1 = fdb_kvs_open((fdb_file_handle *)pfStack_14308,(fdb_kvs_handle **)info_00,"db_custom",
                         (fdb_kvs_config *)kvs_config_00);
    if (fVar1 != FDB_RESULT_SUCCESS) goto LAB_00110f76;
    info_00 = afStack_14268;
    sprintf((char *)info_00,"key%06d",0);
    kvs_config_00 = afStack_14168;
    sprintf((char *)kvs_config_00,"body%06d",0);
    sVar3 = strlen((char *)info_00);
    sVar4 = strlen((char *)kvs_config_00);
    fVar1 = fdb_set_kv((fdb_kvs_handle *)auStack_14300._8_8_,info_00,sVar3,kvs_config_00,sVar4);
    handle = (fdb_kvs_handle *)auStack_14300._8_8_;
    if (fVar1 != FDB_RESULT_SUCCESS) goto LAB_00110f7b;
    info_00 = (fdb_file_info *)0x0;
    handle = pfStack_14308;
    fVar1 = fdb_commit((fdb_file_handle *)pfStack_14308,'\0');
    if (fVar1 != FDB_RESULT_SUCCESS) goto LAB_00110f80;
    uVar9 = 0;
    uVar11 = 0;
    do {
      sprintf((char *)afStack_14268,"key%06d",uVar11);
      sprintf((char *)afStack_14168,"body%06d",uVar11);
      handle = (fdb_kvs_handle *)auStack_14300._0_8_;
      sVar3 = strlen((char *)afStack_14268);
      sVar4 = strlen((char *)afStack_14168);
      kvs_config_00 = afStack_14168;
      info_00 = afStack_14268;
      fVar1 = fdb_set_kv(handle,afStack_14268,sVar3,afStack_14168,sVar4);
      if (fVar1 != FDB_RESULT_SUCCESS) goto LAB_00110f5d;
      info_00 = (fdb_file_info *)(auStack_142e8 + 0x28);
      handle = pfStack_14308;
      fVar1 = fdb_get_file_info((fdb_file_handle *)pfStack_14308,info_00);
      if (fVar1 != FDB_RESULT_SUCCESS) goto LAB_00110f58;
      if (uVar9 < uStack_14298) {
        uVar9 = uStack_14298;
      }
      uVar7 = (int)uVar11 + 1;
      uVar11 = (ulong)uVar7;
    } while (uVar7 != 10000);
    info_00 = (fdb_file_info *)0x0;
    handle = pfStack_14308;
    fVar1 = fdb_commit((fdb_file_handle *)pfStack_14308,'\0');
    if (fVar1 != FDB_RESULT_SUCCESS) goto LAB_00110f85;
    info_00 = (fdb_file_info *)(auStack_142e8 + 0x28);
    handle = pfStack_14308;
    fVar1 = fdb_get_file_info((fdb_file_handle *)pfStack_14308,info_00);
    if (fVar1 != FDB_RESULT_SUCCESS) goto LAB_00110f8a;
    if (uVar9 < uStack_14298) {
      uVar9 = uStack_14298;
    }
    printf("wait for daemon compaction completion... (max file size: %lu)\n",uVar9);
    do {
      sleep(1);
      info_00 = (fdb_file_info *)(auStack_142e8 + 0x28);
      handle = pfStack_14308;
      fVar1 = fdb_get_file_info((fdb_file_handle *)pfStack_14308,
                                (fdb_file_info *)(auStack_142e8 + 0x28));
      if (fVar1 != FDB_RESULT_SUCCESS) goto LAB_00110f62;
    } while (uVar9 <= uStack_14298);
    fVar1 = fdb_close((fdb_file_handle *)pfStack_14308);
    handle = pfStack_14308;
    if (fVar1 == FDB_RESULT_SUCCESS) {
      fVar1 = fdb_shutdown();
      handle = pfStack_14308;
      if (fVar1 == FDB_RESULT_SUCCESS) {
        memleak_end();
        pcVar5 = "%s PASSED\n";
        if (auto_compaction_with_custom_cmp_function()::__test_pass != '\0') {
          pcVar5 = "%s FAILED\n";
        }
        fprintf(_stderr,pcVar5,"auto compaction with custom comparison function");
        return;
      }
      goto LAB_00110f94;
    }
  }
  else {
LAB_00110f67:
    auto_compaction_with_custom_cmp_function();
LAB_00110f6c:
    auto_compaction_with_custom_cmp_function();
LAB_00110f71:
    auto_compaction_with_custom_cmp_function();
LAB_00110f76:
    auto_compaction_with_custom_cmp_function();
LAB_00110f7b:
    auto_compaction_with_custom_cmp_function();
LAB_00110f80:
    auto_compaction_with_custom_cmp_function();
LAB_00110f85:
    auto_compaction_with_custom_cmp_function();
LAB_00110f8a:
    auto_compaction_with_custom_cmp_function();
  }
  auto_compaction_with_custom_cmp_function();
LAB_00110f94:
  auto_compaction_with_custom_cmp_function();
  if (info_00 == kvs_config_00) {
    memcmp(handle,__s2,(size_t)info_00);
    return;
  }
  if (info_00 < kvs_config_00) {
    kvs_config_00 = info_00;
  }
  memcmp(handle,__s2,(size_t)kvs_config_00);
  return;
}

Assistant:

void compaction_daemon_test(size_t time_sec)
{
    TEST_INIT();

    memleak_start();

    int i, r;
    int n = 10000;
    int compaction_threshold = 30;
    int escape = 0;
    fdb_file_handle *dbfile, *dbfile_less, *dbfile_non, *dbfile_manual, *dbfile_new;
    fdb_kvs_handle *db, *db_less, *db_non, *db_manual;
    fdb_kvs_handle *snapshot;
    fdb_doc **doc = alca(fdb_doc*, n);
    fdb_doc *rdoc;
    fdb_file_info info;
    fdb_status status;
    struct timeval ts_begin, ts_cur, ts_gap;

    char keybuf[256], metabuf[256], bodybuf[256];

    // remove previous compact_test files
    r = system(SHELL_DEL" compact_test* > errorlog.txt");
    (void)r;

    fdb_config fconfig = fdb_get_default_config();
    fdb_kvs_config kvs_config = fdb_get_default_kvs_config();
    fconfig.buffercache_size = 0;
    fconfig.wal_threshold = 1024;
    fconfig.flags = FDB_OPEN_FLAG_CREATE;
    fconfig.compaction_mode = FDB_COMPACTION_AUTO;
    fconfig.compaction_threshold = compaction_threshold;
    fconfig.compactor_sleep_duration = 1; // for quick test

    fconfig.num_compactor_threads = 0;
    status = fdb_open(&dbfile, "compact_test", &fconfig);
    TEST_CHK(status == FDB_RESULT_INVALID_CONFIG);

    fconfig.num_compactor_threads = DEFAULT_NUM_COMPACTOR_THREADS;
    // open db
    fdb_open(&dbfile, "compact_test", &fconfig);
    fdb_kvs_open_default(dbfile, &db, &kvs_config);
    status = fdb_set_log_callback(db, logCallbackFunc,
                                  (void *) "compaction_daemon_test");
    TEST_CHK(status == FDB_RESULT_SUCCESS);
    // insert documents
    printf("Initialize..\n");
    for (i=0;i<n;++i){
        sprintf(keybuf, "key%04d", i);
        sprintf(metabuf, "meta%04d", i);
        sprintf(bodybuf, "body%04d", i);
        fdb_doc_create(&doc[i], (void*)keybuf, strlen(keybuf)+1,
            (void*)metabuf, strlen(metabuf)+1, (void*)bodybuf, strlen(bodybuf)+1);
        fdb_set(db, doc[i]);
    }
    // commit
    fdb_commit(dbfile, FDB_COMMIT_NORMAL);
    // close db file
    fdb_close(dbfile);

    // ---- basic retrieve test ------------------------
    // reopen db file
    status = fdb_open(&dbfile, "compact_test", &fconfig);
    TEST_CHK(status == FDB_RESULT_SUCCESS);
    status = fdb_kvs_open_default(dbfile, &db, &kvs_config);
    TEST_CHK(status == FDB_RESULT_SUCCESS);
    status = fdb_set_log_callback(db, logCallbackFunc,
                                  (void *) "compaction_daemon_test");
    TEST_CHK(status == FDB_RESULT_SUCCESS);
    // check db filename
    fdb_get_file_info(dbfile, &info);
    TEST_CHK(!strcmp(info.filename, "compact_test"));

    // retrieve documents
    for (i=0;i<n;++i){
        sprintf(keybuf, "key%04d", i);
        fdb_doc_create(&rdoc, (void*)keybuf, strlen(keybuf)+1,
            NULL, 0, NULL, 0);
        status = fdb_get(db, rdoc);
        //printf("%s %s\n", rdoc->key, rdoc->body);
        TEST_CHK(status == FDB_RESULT_SUCCESS);
        TEST_CMP(rdoc->body, doc[i]->body, rdoc->bodylen);
        fdb_doc_free(rdoc);
    }

    // create a snapshot
    status = fdb_snapshot_open(db, &snapshot, n);
    TEST_CHK(status == FDB_RESULT_SUCCESS);
    // close snapshot
    fdb_kvs_close(snapshot);

    // close db file
    fdb_close(dbfile);

    // ---- handling when metafile is removed ------------
    // remove meta file
    r = system(SHELL_DEL" compact_test.meta > errorlog.txt");
    (void)r;
    // reopen db file
    status = fdb_open(&dbfile, "compact_test", &fconfig);
    TEST_CHK(status == FDB_RESULT_SUCCESS);
    status = fdb_kvs_open_default(dbfile, &db, &kvs_config);
    TEST_CHK(status == FDB_RESULT_SUCCESS);
    status = fdb_set_log_callback(db, logCallbackFunc,
                                  (void *) "compaction_daemon_test");
    TEST_CHK(status == FDB_RESULT_SUCCESS);
    // retrieve documents
    for (i=0;i<n;++i){
        sprintf(keybuf, "key%04d", i);
        fdb_doc_create(&rdoc, (void*)keybuf, strlen(keybuf)+1,
            NULL, 0, NULL, 0);
        status = fdb_get(db, rdoc);
        //printf("%s %s\n", rdoc->key, rdoc->body);
        TEST_CHK(status == FDB_RESULT_SUCCESS);
        TEST_CMP(rdoc->body, doc[i]->body, rdoc->bodylen);
        fdb_doc_free(rdoc);
    }
    // close db file
    fdb_close(dbfile);

    // ---- handling when metafile points to non-exist file ------------
    // remove meta file
    r = system(SHELL_MOVE" compact_test.0 compact_test.23 > errorlog.txt");
    (void)r;
    // reopen db file
    status = fdb_open(&dbfile, "compact_test", &fconfig);
    TEST_CHK(status == FDB_RESULT_SUCCESS);
    status = fdb_kvs_open_default(dbfile, &db, &kvs_config);
    TEST_CHK(status == FDB_RESULT_SUCCESS);
    status = fdb_set_log_callback(db, logCallbackFunc,
                                  (void *) "compaction_daemon_test");
    TEST_CHK(status == FDB_RESULT_SUCCESS);
    // retrieve documents
    for (i=0;i<n;++i){
        sprintf(keybuf, "key%04d", i);
        fdb_doc_create(&rdoc, (void*)keybuf, strlen(keybuf)+1,
            NULL, 0, NULL, 0);
        status = fdb_get(db, rdoc);
        //printf("%s %s\n", rdoc->key, rdoc->body);
        TEST_CHK(status == FDB_RESULT_SUCCESS);
        TEST_CMP(rdoc->body, doc[i]->body, rdoc->bodylen);
        fdb_doc_free(rdoc);
    }
    // close db file
    fdb_close(dbfile);

    // ---- compaction daemon test -------------------
    // db: DB instance to be compacted
    // db_less: DB instance to be compacted but with much lower update throughput
    // db_non: DB instance not to be compacted (auto compaction with threshold = 0)
    // db_manual: DB instance not to be compacted (manual compaction)

    // open & create db_less, db_non and db_manual
    status = fdb_open(&dbfile_less, "compact_test_less", &fconfig);
    TEST_CHK(status == FDB_RESULT_SUCCESS);
    status = fdb_kvs_open_default(dbfile_less, &db_less, &kvs_config);
    TEST_CHK(status == FDB_RESULT_SUCCESS);

    fconfig.compaction_threshold = 0;
    status = fdb_open(&dbfile_non, "compact_test_non", &fconfig);
    TEST_CHK(status == FDB_RESULT_SUCCESS);
    status = fdb_kvs_open_default(dbfile_non, &db_non, &kvs_config);
    TEST_CHK(status == FDB_RESULT_SUCCESS);

    fconfig.compaction_mode = FDB_COMPACTION_MANUAL;
    status = fdb_open(&dbfile_manual, "compact_test_manual", &fconfig);
    TEST_CHK(status == FDB_RESULT_SUCCESS);
    status = fdb_kvs_open_default(dbfile_manual, &db_manual, &kvs_config);
    TEST_CHK(status == FDB_RESULT_SUCCESS);

    // reopen db file
    fconfig.compaction_threshold = 30;
    fconfig.compaction_mode = FDB_COMPACTION_AUTO;
    status = fdb_open(&dbfile, "compact_test", &fconfig);
    TEST_CHK(status == FDB_RESULT_SUCCESS);
    status = fdb_kvs_open_default(dbfile, &db, &kvs_config);
    TEST_CHK(status == FDB_RESULT_SUCCESS);
    status = fdb_set_log_callback(db, logCallbackFunc,
                                  (void *) "compaction_daemon_test");
    TEST_CHK(status == FDB_RESULT_SUCCESS);
    // continuously update documents
    printf("wait for %d seconds..\n", (int)time_sec);
    gettimeofday(&ts_begin, NULL);
    while (!escape) {
        for (i=0;i<n;++i){
            // update db
            fdb_set(db, doc[i]);
            fdb_commit(dbfile, FDB_COMMIT_NORMAL);

            // update db_less (1/100 throughput)
            if (i%100 == 0){
                fdb_set(db_less, doc[i]);
                fdb_commit(dbfile_less, FDB_COMMIT_NORMAL);
            }

            // update db_non
            fdb_set(db_non, doc[i]);
            fdb_commit(dbfile_non, FDB_COMMIT_NORMAL);

            // update db_manual
            fdb_set(db_manual, doc[i]);
            fdb_commit(dbfile_manual, FDB_COMMIT_NORMAL);

            gettimeofday(&ts_cur, NULL);
            ts_gap = _utime_gap(ts_begin, ts_cur);
            if ((size_t)ts_gap.tv_sec >= time_sec) {
                escape = 1;
                break;
            }
        }
    }

    // Change the compaction interval to 60 secs.
    status = fdb_set_daemon_compaction_interval(dbfile, 60);
    TEST_CHK(status == FDB_RESULT_SUCCESS);
    // Change the compaction interval back to 1 sec.
    status = fdb_set_daemon_compaction_interval(dbfile, 1);
    TEST_CHK(status == FDB_RESULT_SUCCESS);

    // perform manual compaction of auto-compact file
    status = fdb_compact(dbfile_non, NULL);
    TEST_CHK(status == FDB_RESULT_SUCCESS);

    // perform manual compaction of manual-compact file
    status = fdb_compact(dbfile_manual, "compact_test_manual_compacted");
    TEST_CHK(status == FDB_RESULT_SUCCESS);

    // open compact_test_manual_compacted using new db handle
    fconfig.compaction_mode = FDB_COMPACTION_MANUAL;
    status = fdb_open(&dbfile_new, "compact_test_manual_compacted", &fconfig);
    TEST_CHK(status == FDB_RESULT_SUCCESS);

    // try to switch compaction mode
    status = fdb_switch_compaction_mode(dbfile_manual, FDB_COMPACTION_AUTO, 30);
    TEST_CHK(status == FDB_RESULT_FILE_IS_BUSY);

    // close db_new
    status = fdb_close(dbfile_new);
    TEST_CHK(status == FDB_RESULT_SUCCESS);

    // switch compaction mode of 'db_manual' from MANUAL to AUTO
    status = fdb_switch_compaction_mode(dbfile_manual, FDB_COMPACTION_AUTO, 10);
    TEST_CHK(status == FDB_RESULT_SUCCESS);

    // change compaction value
    status = fdb_switch_compaction_mode(dbfile_manual, FDB_COMPACTION_AUTO, 30);
    TEST_CHK(status == FDB_RESULT_SUCCESS);

    // close and open with auto-compact option
    status = fdb_close(dbfile_manual);
    TEST_CHK(status == FDB_RESULT_SUCCESS);
    fconfig.compaction_mode = FDB_COMPACTION_AUTO;
    status = fdb_open(&dbfile_manual, "compact_test_manual_compacted", &fconfig);
    TEST_CHK(status == FDB_RESULT_SUCCESS);

    // switch compaction mode of 'db_non' from AUTO to MANUAL
    status = fdb_switch_compaction_mode(dbfile_non, FDB_COMPACTION_MANUAL, 0);
    TEST_CHK(status == FDB_RESULT_SUCCESS);

    // close and open with manual-compact option
    status = fdb_close(dbfile_non);
    TEST_CHK(status == FDB_RESULT_SUCCESS);
    fconfig.compaction_mode = FDB_COMPACTION_MANUAL;
    status = fdb_open(&dbfile_non, "compact_test_non", &fconfig);
    TEST_CHK(status == FDB_RESULT_SUCCESS);

    // Now perform one manual compaction on compact_test_non
    fdb_compact(dbfile_non, "compact_test_non.manual");

    // close all db files except compact_test_non
    fdb_close(dbfile);
    fdb_close(dbfile_less);
    fdb_close(dbfile_manual);

    // open manual compact file (compact_test_non) using auto compact mode
    fconfig.compaction_mode = FDB_COMPACTION_AUTO;
    status = fdb_open(&dbfile, "compact_test_non.manual", &fconfig);
    TEST_CHK(status == FDB_RESULT_INVALID_COMPACTION_MODE);

    // Attempt to destroy manual compact file using auto compact mode
    status = fdb_destroy("compact_test_non.manual", &fconfig);
    TEST_CHK(status == FDB_RESULT_INVALID_COMPACTION_MODE);

    // open auto copmact file (compact_test_manual_compacted) using manual compact mode
    fconfig.compaction_mode = FDB_COMPACTION_MANUAL;
    status = fdb_open(&dbfile, "compact_test_manual_compacted", &fconfig);
    TEST_CHK(status == FDB_RESULT_INVALID_COMPACTION_MODE);

    // Attempt to destroy auto copmact file using manual compact mode
    status = fdb_destroy("compact_test_manual_compacted", &fconfig);
    TEST_CHK(status == FDB_RESULT_INVALID_COMPACTION_MODE);

    // DESTROY auto copmact file with correct mode
    fconfig.compaction_mode = FDB_COMPACTION_AUTO;
    status = fdb_destroy("compact_test_manual_compacted", &fconfig);
    TEST_CHK(status == FDB_RESULT_SUCCESS);

    // DESTROY manual compacted file with past version open!
    fconfig.compaction_mode = FDB_COMPACTION_MANUAL;
    status = fdb_destroy("compact_test_non.manual", &fconfig);
    TEST_CHK(status == FDB_RESULT_FILE_IS_BUSY);
    fdb_close(dbfile_non);

    // Simulate a database crash by doing a premature shutdown
    // Note that db_non was never closed properly
    status = fdb_shutdown();
    TEST_CHK(status == FDB_RESULT_SUCCESS);

    status = fdb_destroy("compact_test_non.manual", &fconfig);
    TEST_CHK(status == FDB_RESULT_SUCCESS);

    // Attempt to read-only auto compacted and destroyed file
    fconfig.flags = FDB_OPEN_FLAG_RDONLY;
    status = fdb_open(&dbfile, "./compact_test_manual_compacted", &fconfig);
    TEST_CHK(status == FDB_RESULT_NO_SUCH_FILE);

    status = fdb_open(&dbfile, "./compact_test_manual_compacted.meta", &fconfig);
    TEST_CHK(status == FDB_RESULT_NO_SUCH_FILE);

    // Attempt to read-only past version of manually compacted destroyed file
    status = fdb_open(&dbfile, "compact_test_non", &fconfig);
    TEST_CHK(status == FDB_RESULT_NO_SUCH_FILE);

    // Attempt to read-only current version of manually compacted destroyed file
    status = fdb_open(&dbfile, "compact_test_non.manual", &fconfig);
    TEST_CHK(status == FDB_RESULT_NO_SUCH_FILE);

    // free all documents
    for (i=0;i<n;++i){
        fdb_doc_free(doc[i]);
    }

    // free all resources
    fdb_shutdown();

    memleak_end();

    TEST_RESULT("compaction daemon test");
}